

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testrunner.cpp
# Opt level: O0

void __thiscall trun::TestRunner::ExecuteTests(TestRunner *this)

{
  TestExecutiontype TVar1;
  ILogger *pIVar2;
  uint8_t uVar3;
  bool bVar4;
  int iVar5;
  element_type *peVar6;
  undefined4 extraout_var;
  char *pcVar7;
  Version *pVVar8;
  Config *pCVar9;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined1 local_68 [4];
  TestExecutiontype oldTestExecutionType;
  string local_38;
  Timer local_18;
  Timer t;
  TestRunner *this_local;
  
  t.time_start.__d.__r = (time_point)(time_point)this;
  Timer::Timer(&local_18);
  pIVar2 = this->pLogger;
  peVar6 = std::__shared_ptr_access<trun::IDynLibrary,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<trun::IDynLibrary,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)&this->library);
  iVar5 = (*peVar6->_vptr_IDynLibrary[6])();
  pcVar7 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                     ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      CONCAT44(extraout_var,iVar5));
  (*pIVar2->_vptr_ILogger[6])(pIVar2,"Starting library test for: %s",pcVar7);
  pIVar2 = this->pLogger;
  peVar6 = std::__shared_ptr_access<trun::IDynLibrary,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<trun::IDynLibrary,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)&this->library);
  pVVar8 = IDynLibrary::GetVersion(peVar6);
  Version::AsString_abi_cxx11_(&local_38,pVVar8);
  pcVar7 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                     (&local_38);
  (*pIVar2->_vptr_ILogger[6])(pIVar2,"Library using test-interface version: %s",pcVar7);
  std::__cxx11::string::~string((string *)&local_38);
  Timer::Reset(&local_18);
  pCVar9 = Config::Instance();
  if ((pCVar9->isSubProcess & 1U) == 0) {
    peVar6 = std::__shared_ptr_access<trun::IDynLibrary,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<trun::IDynLibrary,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&this->library);
    iVar5 = (*peVar6->_vptr_IDynLibrary[6])();
    pcVar7 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                       ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        CONCAT44(extraout_var_00,iVar5));
    printf("---> Start Module \t%s\n",pcVar7);
    peVar6 = std::__shared_ptr_access<trun::IDynLibrary,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<trun::IDynLibrary,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&this->library);
    pVVar8 = IDynLibrary::GetVersion(peVar6);
    Version::AsString_abi_cxx11_((string *)local_68,pVVar8);
    pcVar7 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                       ((string *)local_68);
    printf("---> Mod.Test.Ver \t%s\n",pcVar7);
    std::__cxx11::string::~string((string *)local_68);
  }
  SetCurrentTestRunner(this);
  pCVar9 = Config::Instance();
  TVar1 = pCVar9->testExecutionType;
  if (TVar1 == kThreaded) {
    peVar6 = std::__shared_ptr_access<trun::IDynLibrary,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<trun::IDynLibrary,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&this->library);
    pVVar8 = IDynLibrary::GetVersion(peVar6);
    uVar3 = Version::Major(pVVar8);
    if (uVar3 == '\x01') {
      pCVar9 = Config::Instance();
      pCVar9->testExecutionType = kThreadedWithExit;
    }
  }
  bVar4 = ExecuteMain(this);
  if (bVar4) {
    ExecuteModuleTests(this);
    ExecuteMainExit(this);
  }
  pCVar9 = Config::Instance();
  pCVar9->testExecutionType = TVar1;
  pCVar9 = Config::Instance();
  if ((pCVar9->isSubProcess & 1U) == 0) {
    peVar6 = std::__shared_ptr_access<trun::IDynLibrary,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<trun::IDynLibrary,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&this->library);
    iVar5 = (*peVar6->_vptr_IDynLibrary[6])();
    pcVar7 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                       ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        CONCAT44(extraout_var_01,iVar5));
    printf("<--- End Module  \t%s\n",pcVar7);
    pIVar2 = this->pLogger;
    Timer::Sample(&local_18);
    (*pIVar2->_vptr_ILogger[6])(pIVar2,"Module done (%.3f sec)");
  }
  return;
}

Assistant:

void TestRunner::ExecuteTests() {
    // Create and sort tests according to naming convention
    Timer t;
    pLogger->Info("Starting library test for: %s", library->Name().c_str());
    pLogger->Info("Library using test-interface version: %s", library->GetVersion().AsString().c_str());
    t.Reset();

    if (!Config::Instance().isSubProcess) {
        printf("---> Start Module \t%s\n", library->Name().c_str());
        printf("---> Mod.Test.Ver \t%s\n",  library->GetVersion().AsString().c_str());
    }

    // Update the thread context with ourselves, we do this directly as it won't change
    SetCurrentTestRunner(this);

    // In case of version 1 for this library we should use 'kThreadedWithExit'
    // Since V1 of the testrunner didn't return a value for the ASSERT
    auto oldTestExecutionType = Config::Instance().testExecutionType;
    if ((oldTestExecutionType == TestExecutiontype::kThreaded) && (library->GetVersion().Major() == 1)) {
        Config::Instance().testExecutionType = TestExecutiontype::kThreadedWithExit;
    }

    // Execute...
    if (ExecuteMain()) {
        ExecuteModuleTests();
        ExecuteMainExit();
    }

    // Restore the test execution type
    Config::Instance().testExecutionType = oldTestExecutionType;

    if (!Config::Instance().isSubProcess) {
        printf("<--- End Module  \t%s\n", library->Name().c_str());
        pLogger->Info("Module done (%.3f sec)", t.Sample());
    }
}